

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O3

void capture_parameter(Constraint *constraint,char *function,CgreenValue actual,char *test_file,
                      int test_line,TestReporter *reporter)

{
  memmove((constraint->expected_value).value.pointer_value,&actual.value,
          constraint->size_of_expected_value);
  return;
}

Assistant:

static void capture_parameter(Constraint *constraint, const char *function, CgreenValue actual,
                              const char *test_file, int test_line, TestReporter *reporter) {
    (void)function;
    (void)test_file;
    (void)test_line;
    (void)reporter;

    if ((sizeof(intptr_t) != constraint->size_of_expected_value) && bigendian()) {
        // Then the beginning of a smaller value is not stored at the beginning of the actual.value union
        size_t offset = sizeof(intptr_t) - constraint->size_of_expected_value;
        // Offset is in bytes so we need to cast &actual.value to that before adding the offset
        void *start_address = (unsigned char *)&actual.value + offset;
        memmove(constraint->expected_value.value.pointer_value, start_address, constraint->size_of_expected_value);

    } else
        memmove(constraint->expected_value.value.pointer_value, &actual.value,
                constraint->size_of_expected_value);
    }